

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O2

void Js::SetUNumberFormatDigitOptions(UNumberFormat *fmt,DynamicObject *state)

{
  BOOL BVar1;
  int iVar2;
  PropertyIds propertyId;
  PropertyIds propertyId_00;
  undefined8 uVar3;
  undefined4 local_34;
  
  propertyId._value = 0x248;
  BVar1 = JavascriptOperators::HasProperty(&state->super_RecyclableObject,0x248);
  if (BVar1 == 0) {
    iVar2 = AssertIntegerProperty(state,(PropertyIds)0x247);
    unum_setAttribute_70(fmt,4,iVar2);
    local_34 = 6;
    propertyId_00._value = 0x244;
    uVar3 = 7;
    propertyId._value = 0x246;
  }
  else {
    unum_setAttribute_70(fmt,0x10,1);
    local_34 = 0x12;
    propertyId_00._value = 0x245;
    uVar3 = 0x11;
  }
  iVar2 = AssertIntegerProperty(state,propertyId);
  unum_setAttribute_70(fmt,uVar3,iVar2);
  iVar2 = AssertIntegerProperty(state,propertyId_00);
  unum_setAttribute_70(fmt,local_34,iVar2);
  return;
}

Assistant:

static void SetUNumberFormatDigitOptions(UNumberFormat *fmt, DynamicObject *state)
    {
        if (JavascriptOperators::HasProperty(state, PropertyIds::minimumSignificantDigits))
        {
            unum_setAttribute(fmt, UNUM_SIGNIFICANT_DIGITS_USED, true);
            unum_setAttribute(fmt, UNUM_MIN_SIGNIFICANT_DIGITS, AssertIntegerProperty(state, PropertyIds::minimumSignificantDigits));
            unum_setAttribute(fmt, UNUM_MAX_SIGNIFICANT_DIGITS, AssertIntegerProperty(state, PropertyIds::maximumSignificantDigits));
        }
        else
        {
            unum_setAttribute(fmt, UNUM_MIN_INTEGER_DIGITS, AssertIntegerProperty(state, PropertyIds::minimumIntegerDigits));
            unum_setAttribute(fmt, UNUM_MIN_FRACTION_DIGITS, AssertIntegerProperty(state, PropertyIds::minimumFractionDigits));
            unum_setAttribute(fmt, UNUM_MAX_FRACTION_DIGITS, AssertIntegerProperty(state, PropertyIds::maximumFractionDigits));
        }
    }